

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::retry_web_seed
          (torrent *this,peer_connection *p,
          optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> retry)

{
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *plVar1;
  time_point32 tVar2;
  int iVar3;
  undefined4 extraout_var;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  unique_lock<std::mutex> local_38;
  
  plVar1 = &this->m_web_seeds;
  p_Var5 = (this->m_web_seeds).
           super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)plVar1) {
    p_Var4 = (_List_node_base *)&p->super_peer_connection_interface;
    if (p == (peer_connection *)0x0) {
      p_Var4 = (_List_node_base *)0x0;
    }
    do {
      if (p_Var4 == p_Var5[9]._M_next) break;
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)plVar1);
  }
  if (((p_Var5 != (_List_node_base *)plVar1) && (*(char *)((long)&p_Var5[0xb]._M_next + 2) == '\0'))
     && (*(char *)((long)&p_Var5[0xb]._M_next + 6) == '\0')) {
    tVar2 = time_now32();
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [0x2e])();
    local_38._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar3) + 0x438);
    local_38._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_38);
    local_38._M_owns = true;
    if (((ulong)retry.
                super__Optional_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true,_true>.
                _M_payload.
                super__Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> >>
         0x20 & 1) == 0) {
      retry.super__Optional_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>.
      _4_4_ = 0;
      retry.super__Optional_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>.
      _M_payload = (_Storage<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true>)
                   *(uint *)(CONCAT44(extraout_var,iVar3) + 0x1dc);
    }
    ::std::unique_lock<std::mutex>::~unique_lock(&local_38);
    *(int *)((long)&p_Var5[6]._M_prev + 4) =
         (int)retry.
              super__Optional_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>,_true,_true>.
              _M_payload.
              super__Optional_payload_base<std::chrono::duration<int,_std::ratio<1L,_1L>_>_>.
              _M_payload + (int)tVar2.__d.__r;
  }
  return;
}

Assistant:

void torrent::retry_web_seed(peer_connection* p, std::optional<seconds32> const retry)
	{
		TORRENT_ASSERT(is_single_thread());
		auto const i = std::find_if(m_web_seeds.begin(), m_web_seeds.end()
			, [p] (web_seed_t const& ws) { return ws.peer_info.connection == p; });

		TORRENT_ASSERT(i != m_web_seeds.end());
		if (i == m_web_seeds.end()) return;
		if (i->removed || i->disabled) return;
		i->retry = aux::time_now32() + retry.value_or(seconds32(
			settings().get_int(settings_pack::urlseed_wait_retry)));
	}